

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall
FIX::DataDictionary::checkIsInMessage(DataDictionary *this,FieldBase *field,MsgType *msgType)

{
  int field_00;
  TagNotDefinedForMessage *this_00;
  bool bVar1;
  string local_48;
  
  bVar1 = isMsgField(this,&(msgType->super_StringField).super_FieldBase.m_string,field->m_tag);
  if (bVar1) {
    return;
  }
  this_00 = (TagNotDefinedForMessage *)__cxa_allocate_exception(0x58);
  field_00 = field->m_tag;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  TagNotDefinedForMessage::TagNotDefinedForMessage(this_00,field_00,&local_48);
  __cxa_throw(this_00,&TagNotDefinedForMessage::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(TagNotDefinedForMessage) {
    if (!isMsgField(msgType, field.getTag())) {
      throw TagNotDefinedForMessage(field.getTag());
    }
  }